

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *stream,QEasingCurve *easing)

{
  long *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QEasingCurveFunction *config;
  Type type;
  bool hasConfig;
  quint64 ptr_func;
  quint8 int_type;
  bool *in_stack_ffffffffffffff88;
  QDataStream *in_stack_ffffffffffffff90;
  QEasingCurve *in_stack_ffffffffffffff98;
  QMessageLogger *in_stack_ffffffffffffffa0;
  QMessageLogger local_30;
  char local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = -0x56;
  QDataStream::operator>>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (local_9 == '/') {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),in_stack_ffffffffffffff88);
    QMessageLogger::warning
              (&local_30,
               "QEasingCurve: Cannot deserialize an easing curve with a custom easing function");
    QDataStream::setStatus(in_RDI,ReadCorruptData);
  }
  QEasingCurve::setType(in_stack_ffffffffffffff98,(Type)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  QDataStream::operator>>(in_stack_ffffffffffffff90,(quint64 *)in_stack_ffffffffffffff88);
  QDataStream::operator>>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (*(long **)(*in_RSI + 8) != (long *)0x0) {
    (**(code **)(**(long **)(*in_RSI + 8) + 8))();
  }
  *(undefined8 *)(*in_RSI + 8) = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator>>(QDataStream &stream, QEasingCurve &easing)
{
    QEasingCurve::Type type;
    quint8 int_type;
    stream >> int_type;
    type = static_cast<QEasingCurve::Type>(int_type);
    if (type == QEasingCurve::Custom) {
        qWarning("QEasingCurve: Cannot deserialize an easing curve with a custom easing function");
        stream.setStatus(QDataStream::ReadCorruptData);
        type = QEasingCurve::Linear;
    }
    easing.setType(type);

    // Unused; for backwards compatibility
    [[maybe_unused]] quint64 ptr_func;
    stream >> ptr_func;

    bool hasConfig;
    stream >> hasConfig;
    delete easing.d_ptr->config;
    easing.d_ptr->config = nullptr;
    if (hasConfig) {
        QEasingCurveFunction *config = curveToFunctionObject(type);
        stream >> config;
        easing.d_ptr->config = config;
    }
    return stream;
}